

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall
RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result,bool more_ready)

{
  _Base_ptr p_Var1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_00;
  _Base_ptr p_Var4;
  TokenPool *tokens;
  iterator __position;
  
  (this->subprocs_).token_available_ = false;
  while( true ) {
    this_00 = SubprocessSet::NextFinished(&this->subprocs_);
    if (this_00 != (Subprocess *)0x0) {
      if (this->tokens_ != (TokenPool *)0x0) {
        (*this->tokens_->_vptr_TokenPool[4])();
      }
      EVar3 = Subprocess::Finish(this_00);
      result->status = EVar3;
      Subprocess::GetOutput_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&result->output);
      __position._M_node = &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = __position._M_node;
      for (p_Var1 = (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var1 != (_Base_ptr)0x0;
          p_Var1 = (&p_Var1->_M_left)[*(Subprocess **)(p_Var1 + 1) < this_00]) {
        if (*(Subprocess **)(p_Var1 + 1) >= this_00) {
          p_Var4 = p_Var1;
        }
      }
      if ((p_Var4 != __position._M_node) && (*(Subprocess **)(p_Var4 + 1) <= this_00)) {
        __position._M_node = p_Var4;
      }
      result->edge = (Edge *)__position._M_node[1]._M_parent;
      std::
      _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
      ::erase_abi_cxx11_((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                          *)&this->subproc_to_edge_,__position);
      Subprocess::~Subprocess(this_00);
      operator_delete(this_00,0x30);
      return true;
    }
    if ((this->subprocs_).token_available_ != false) break;
    if (more_ready) {
      tokens = this->tokens_;
    }
    else {
      tokens = (TokenPool *)0x0;
    }
    bVar2 = SubprocessSet::DoWork(&this->subprocs_,tokens);
    if (bVar2) {
      return false;
    }
  }
  result->status = ExitTokenAvailable;
  return true;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result, bool more_ready) {
  Subprocess* subproc;
  subprocs_.ResetTokenAvailable();
  while (((subproc = subprocs_.NextFinished()) == NULL) &&
         !subprocs_.IsTokenAvailable()) {
    bool interrupted = subprocs_.DoWork(more_ready ? tokens_ : NULL);
    if (interrupted)
      return false;
  }

  // token became available
  if (subproc == NULL) {
    result->status = ExitTokenAvailable;
    return true;
  }

  // command completed
  if (tokens_)
    tokens_->Release();

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}